

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::IndexFinder::find
          (SelectionSet *__return_storage_ptr__,IndexFinder *this,int begMolIndex,int endMolIndex)

{
  int iVar1;
  long lVar2;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_40,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_40);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar1 = endMolIndex - begMolIndex;
  if (iVar1 != 0 && begMolIndex <= endMolIndex) {
    lVar2 = (long)begMolIndex * 0x18;
    do {
      SelectionSet::orOperator
                (__return_storage_ptr__,
                 (SelectionSet *)
                 ((long)&(((this->selectionSets_).
                           super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl + lVar2));
      lVar2 = lVar2 + 0x18;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet IndexFinder::find(int begMolIndex, int endMolIndex) {
    SelectionSet ss(nObjects_);

#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (int i = begMolIndex; i < endMolIndex; ++i) {
#ifdef IS_MPI
      proc = info_->getMolToProc(i);

      if (proc == worldRank) {
#endif
        ss |= selectionSets_[i];
#ifdef IS_MPI
      }
#endif
    }
    return ss;
  }